

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

Slice __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
resolveExternals(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint8_t *current;
  Slice in_stack_ffffffffffffffe0;
  uint8_t *local_18;
  Slice local_8;
  
  local_18 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x122813);
  while (*local_18 == '\x1d') {
    Slice::Slice((Slice *)&stack0xffffffffffffffe0,local_18);
    local_18 = (uint8_t *)extractPointer(in_stack_ffffffffffffffe0._start);
  }
  Slice::Slice(&local_8,local_18);
  return (Slice)local_8._start;
}

Assistant:

SliceType resolveExternals() const {
    uint8_t const* current = start();
    while (*current == 0x1d) {
      current =
          reinterpret_cast<uint8_t const*>(SliceType(current).extractPointer());
    }
    return SliceType(current);
  }